

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

ValueType __thiscall wabt::interp::Store::GetValueType(Store *this,Ref ref)

{
  Enum EVar1;
  unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_> *puVar2;
  ulong uVar3;
  
  puVar2 = FreeList<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>
           ::Get(&this->objects_,ref.index);
  uVar3 = (ulong)((puVar2->_M_t).
                  super___uniq_ptr_impl<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_wabt::interp::Object_*,_std::default_delete<wabt::interp::Object>_>
                  .super__Head_base<0UL,_wabt::interp::Object_*,_false>._M_head_impl)->kind_;
  EVar1 = Anyref;
  if (uVar3 < 5) {
    EVar1 = *(Enum *)(&DAT_0018064c + uVar3 * 4);
  }
  return (ValueType)EVar1;
}

Assistant:

ValueType Store::GetValueType(Ref ref) const {
  Object* obj = objects_.Get(ref.index).get();
  switch (obj->kind()) {
    case ObjectKind::Null:        return ValueType::Nullref;
    case ObjectKind::Foreign:     return ValueType::Hostref;
    case ObjectKind::DefinedFunc:
    case ObjectKind::HostFunc:    return ValueType::Funcref;
    default:                      return ValueType::Anyref;
  }
}